

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O3

int coda_cursor_read_bytes(coda_cursor *cursor,uint8_t *dst,int64_t offset,int64_t length)

{
  coda_backend cVar1;
  coda_dynamic_type_struct *pcVar2;
  int iVar3;
  undefined8 uVar4;
  char *message;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar2 = cursor->stack[cursor->n - 1].type, pcVar2 == (coda_dynamic_type_struct *)0x0)) {
    message = "invalid cursor argument (%s:%u)";
    uVar4 = 0xb1d;
  }
  else if (dst == (uint8_t *)0x0) {
    message = "dst argument is NULL (%s:%u)";
    uVar4 = 0xb22;
  }
  else if (offset < 0) {
    message = "offset argument is negative (%s:%u)";
    uVar4 = 0xb27;
  }
  else {
    if (-1 < length) {
      if (length == 0) {
        return 0;
      }
      cVar1 = pcVar2->backend;
      if (cVar1 == coda_backend_memory) {
        iVar3 = coda_mem_cursor_read_bytes(cursor,dst,offset,length);
        return iVar3;
      }
      if (cVar1 == coda_backend_binary) {
        iVar3 = coda_bin_cursor_read_bytes(cursor,dst,offset,length);
        return iVar3;
      }
      if (cVar1 != coda_backend_ascii) {
        coda_set_error(-0x69,"can not read this data using a raw bytes data type");
        return -1;
      }
      iVar3 = coda_ascii_cursor_read_bytes(cursor,dst,offset,length);
      return iVar3;
    }
    message = "length argument is negative (%s:%u)";
    uVar4 = 0xb2c;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar4);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_bytes(const coda_cursor *cursor, uint8_t *dst, int64_t offset, int64_t length)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (offset < 0)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "offset argument is negative (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (length < 0)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "length argument is negative (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (length == 0)
    {
        return 0;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_bytes(cursor, dst, offset, length);
        case coda_backend_binary:
            return coda_bin_cursor_read_bytes(cursor, dst, offset, length);
        case coda_backend_memory:
            return coda_mem_cursor_read_bytes(cursor, dst, offset, length);
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_cdf:
        case coda_backend_netcdf:
        case coda_backend_grib:
            break;
    }

    coda_set_error(CODA_ERROR_INVALID_TYPE, "can not read this data using a raw bytes data type");
    return -1;
}